

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::end_pass(memory_tree *b)

{
  ostream *poVar1;
  size_t sVar2;
  void *this;
  long in_RDI;
  
  *(long *)(in_RDI + 0xb8) = *(long *)(in_RDI + 0xb8) + 1;
  poVar1 = std::operator<<((ostream *)&std::cout,"######### Current Pass: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0xb8));
  poVar1 = std::operator<<(poVar1,", with number of memories strored so far: ");
  sVar2 = v_array<example_*>::size((v_array<example_*> *)(in_RDI + 0x28));
  this = (void *)std::ostream::operator<<(poVar1,sVar2);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void end_pass(memory_tree& b){
        b.current_pass ++;
        cout<<"######### Current Pass: "<<b.current_pass<<", with number of memories strored so far: "<<b.examples.size()<<endl;
    }